

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseDataList
                 (char *in,char *end,ValueType type,Value **data,size_t *numValues,Reference **refs,
                 size_t *numRefs)

{
  undefined4 uVar1;
  pointer names_00;
  pointer ppNVar2;
  bool bVar3;
  ulong uVar4;
  char *in_00;
  Reference *this;
  ValueType floatType;
  undefined4 in_register_00000014;
  byte *in_01;
  Value *local_78;
  undefined8 local_70;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *local_50;
  
  local_70 = CONCAT44(in_register_00000014,type);
  *data = (Value *)0x0;
  *numRefs = 0;
  *numValues = 0;
  if ((in != end && in != (char *)0x0) && (in = lookForNextToken<char>(in,end), *in == 0x7b)) {
    uVar4 = (ulong)((byte *)in)[1];
    in_01 = (byte *)in + 1;
    local_50 = (Value *)0x0;
    uVar1 = (undefined4)local_70;
    do {
      if ((char)uVar4 == '}') break;
      local_78 = (Value *)0x0;
      in_00 = lookForNextToken<char>((char *)in_01,end);
      floatType = (ValueType)local_70;
      switch(uVar1) {
      default:
        goto switchD_0058cb7f_caseD_0;
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
LAB_0058cb8f:
        in_00 = parseIntegerLiteral(in_00,end,&local_78,floatType);
        break;
      case 9:
      case 10:
      case 0xb:
LAB_0058cba7:
        in_00 = parseFloatingLiteral(in_00,end,&local_78,floatType);
        break;
      case 0xc:
switchD_0058cb7f_caseD_c:
        in_00 = parseStringLiteral(in_00,end,&local_78);
        break;
      case 0xd:
        names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        in_00 = parseReference(in_00,end,&names);
        ppNVar2 = names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        names_00 = names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this = (Reference *)operator_new(0x10);
          Reference::Reference(this,(long)ppNVar2 - (long)names_00 >> 3,names_00);
          *refs = this;
          *numRefs = (long)names.
                           super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)names.
                           super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
        }
        std::_Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::~_Vector_base
                  (&names.
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>);
        break;
      case 0xffffffff:
        bVar3 = isInteger<char>(in_00,end);
        if (bVar3) {
          floatType = ddl_int32;
          goto LAB_0058cb8f;
        }
        bVar3 = isFloat<char>(in_00,end);
        if (bVar3) {
          floatType = ddl_float;
          goto LAB_0058cba7;
        }
        if (*in_00 == '\"') goto switchD_0058cb7f_caseD_c;
        bVar3 = isHexLiteral<char>(in_00,end);
        if (bVar3) {
          in_00 = parseHexaLiteral(in_00,end,&local_78);
        }
      }
      if (local_78 != (Value *)0x0) {
        if (*data == (Value *)0x0) {
          *data = local_78;
        }
        else {
          Value::setNext(local_50,local_78);
        }
        *numValues = *numValues + 1;
        local_50 = local_78;
      }
switchD_0058cb7f_caseD_0:
      in_01 = (byte *)getNextSeparator<char>(in_00,end);
      uVar4 = (ulong)*in_01;
    } while (((uVar4 < 0x2d) && ((0x100100000200U >> (uVar4 & 0x3f) & 1) != 0)) || (*in_01 == 0x7d))
    ;
    in = (char *)(in_01 + 1);
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseDataList( char *in, char *end, Value::ValueType type, Value **data, 
                                    size_t &numValues, Reference **refs, size_t &numRefs ) {
    *data = ddl_nullptr;
    numValues = numRefs = 0;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in == '{' ) {
        ++in;
        Value *current( ddl_nullptr ), *prev( ddl_nullptr );
        while( '}' != *in ) {
            current = ddl_nullptr;
            in = lookForNextToken( in, end );
            if ( Value::ddl_ref == type ) {
                std::vector<Name*> names;
                in = parseReference( in, end, names );
                if ( !names.empty() ) {
                    Reference *ref = new Reference( names.size(), &names[ 0 ] );
                    *refs = ref;
                    numRefs = names.size();
                }
            } else  if ( Value::ddl_none == type ) {
                if (isInteger( in, end )) {
                    in = parseIntegerLiteral( in, end, &current );
                } else if (isFloat( in, end )) {
                    in = parseFloatingLiteral( in, end, &current );
                } else if (isStringLiteral( *in )) {
                    in = parseStringLiteral( in, end, &current );
                } else if (isHexLiteral( in, end )) {
                    in = parseHexaLiteral( in, end, &current );
                }
            } else {
                switch(type){
                    case Value::ddl_int8:
                    case Value::ddl_int16:
                    case Value::ddl_int32:
                    case Value::ddl_int64:
                    case Value::ddl_unsigned_int8:
                    case Value::ddl_unsigned_int16:
                    case Value::ddl_unsigned_int32:
                    case Value::ddl_unsigned_int64:
                        in = parseIntegerLiteral( in, end, &current, type);
                        break;
                    case Value::ddl_half:
                    case Value::ddl_float:
                    case Value::ddl_double:
                        in = parseFloatingLiteral( in, end, &current, type);
                        break;
                    case Value::ddl_string:
                        in = parseStringLiteral( in, end, &current );
                        break;
                    default:
                        break;
                }
            }

            if( ddl_nullptr != current ) {
                if( ddl_nullptr == *data ) {
                    *data = current;
                    prev = current;
                } else {
                    prev->setNext( current );
                    prev = current;
                }
                ++numValues;
            }

            in = getNextSeparator( in, end );
            if( ',' != *in && Grammar::CloseBracketToken[ 0 ] != *in && !isSpace( *in ) ) {
                break;
            }
        }
        ++in;
    }

    return in;
}